

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::renameFile(Forth *this)

{
  uint uVar1;
  uint src;
  uint uVar2;
  int iVar3;
  char *__old;
  char *__new;
  ForthStack<unsigned_int> *this_00;
  undefined1 local_80 [4];
  int result;
  string newName;
  undefined1 local_50 [8];
  string oldName;
  uint caddrOld;
  size_t lengthOld;
  uint caddrNew;
  size_t lengthNew;
  Forth *this_local;
  
  requireDStackDepth(this,4,"RENAME-FILE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  src = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  pop(this);
  oldName.field_2._12_4_ = ForthStack<unsigned_int>::getTop(this_00);
  std::__cxx11::string::string((string *)local_50);
  moveFromDataSpace(this,(string *)local_50,oldName.field_2._12_4_,(ulong)uVar2);
  std::__cxx11::string::string((string *)local_80);
  moveFromDataSpace(this,(string *)local_80,src,(ulong)uVar1);
  __old = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  __new = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  iVar3 = rename(__old,__new);
  uVar1 = 0xffffffb8;
  if (iVar3 == 0) {
    uVar1 = 0;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar1);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void renameFile() {
	REQUIRE_DSTACK_DEPTH(4, "RENAME-FILE");
	auto lengthNew = SIZE_T(dStack.getTop()); pop();
	auto caddrNew = (dStack.getTop()); pop();
	auto lengthOld = SIZE_T(dStack.getTop()); pop();
	auto caddrOld = (dStack.getTop());
	std::string oldName{};
	moveFromDataSpace(oldName, caddrOld, lengthOld);
	std::string newName{};
	moveFromDataSpace(newName, caddrNew, lengthNew);
	auto result = std::rename(oldName.c_str(), newName.c_str());
	dStack.setTop(static_cast<Cell>(result?errorRenameFile:0));
}